

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O2

int csp_transaction_persistent
              (csp_conn_t *conn,uint32_t timeout,void *outbuf,int outlen,void *inbuf,int inlen)

{
  csp_packet_t *pcVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (outlen < 0x101) {
    pcVar1 = csp_buffer_get(0);
    uVar2 = 0;
    if (pcVar1 != (csp_packet_t *)0x0) {
      if (outbuf != (void *)0x0 && 0 < outlen) {
        memcpy(&pcVar1->field_5,outbuf,(ulong)(uint)outlen);
      }
      pcVar1->length = (uint16_t)outlen;
      csp_send(conn,pcVar1);
      if (inlen == 0) {
        uVar2 = 1;
      }
      else {
        pcVar1 = csp_read(conn,timeout);
        uVar2 = 0;
        if (pcVar1 != (csp_packet_t *)0x0) {
          if ((uint)pcVar1->length == inlen || inlen == -1) {
            memcpy(inbuf,&pcVar1->field_5,(ulong)pcVar1->length);
            uVar2 = (uint)pcVar1->length;
          }
          else {
            csp_dbg_inval_reply = csp_dbg_inval_reply + '\x01';
            uVar2 = 0;
          }
          csp_buffer_free(pcVar1);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int csp_transaction_persistent(csp_conn_t * conn, uint32_t timeout, void * outbuf, int outlen, void * inbuf, int inlen) {

	if(outlen > CSP_BUFFER_SIZE){
		return 0;
	}

	csp_packet_t * packet = csp_buffer_get(0);
	if (packet == NULL)
		return 0;

	/* Copy the request */
	if (outlen > 0 && outbuf != NULL)
		memcpy(packet->data, outbuf, outlen);
	packet->length = outlen;

	csp_send(conn, packet);

	/* If no reply is expected, return now */
	if (inlen == 0)
		return 1;

	packet = csp_read(conn, timeout);
	if (packet == NULL)
		return 0;

	if ((inlen != -1) && ((int)packet->length != inlen)) {
		csp_dbg_inval_reply++;
		csp_buffer_free(packet);
		return 0;
	}

	memcpy(inbuf, packet->data, packet->length);
	int length = packet->length;
	csp_buffer_free(packet);
	return length;
}